

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkCore.c
# Opt level: O2

int Lpk_ResynthesizeNode(Lpk_Man_t *p)

{
  int *piVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  abctime aVar6;
  abctime aVar7;
  Abc_Obj_t *pAVar8;
  uint *pTruth;
  Kit_DsdNtk_t *pNtk;
  Kit_DsdObj_t *pKVar9;
  Lpk_Cut_t *pCut;
  ulong uVar10;
  ulong uVar11;
  
  aVar6 = Abc_Clock();
  iVar3 = Lpk_NodeCuts(p);
  aVar7 = Abc_Clock();
  p->timeCuts = p->timeCuts + (aVar7 - aVar6);
  if (iVar3 == 0) {
    iVar3 = 0;
  }
  else {
    if (p->pPars->fVeryVerbose != 0) {
      printf("Node %5d : Mffc size = %5d. Cuts = %5d.\n",(ulong)(uint)p->pObj->Id,
             (ulong)(uint)p->nMffc,(ulong)(uint)p->nEvals);
    }
    iVar3 = p->nEvals;
    p->nCutsTotal = p->nCutsTotal + p->nCuts;
    p->nCutsUseful = p->nCutsUseful + iVar3;
    uVar10 = 0;
    while (((long)uVar10 < (long)iVar3 && ((uVar10 != 1 || (p->pPars->fFirst == 0))))) {
      pCut = p->pCuts + p->pEvals[uVar10];
      for (uVar11 = 0; uVar11 < (*(uint *)pCut & 0x3f); uVar11 = uVar11 + 1) {
        pAVar8 = Abc_NtkObj(p->pNtk,pCut->pLeaves[uVar11]);
        piVar1 = &(pAVar8->vFanouts).nSize;
        *piVar1 = *piVar1 + 1;
      }
      iVar3 = Abc_NodeMffcLabel(p->pObj);
      for (uVar11 = 0; uVar4 = *(uint *)pCut, uVar11 < (uVar4 & 0x3f); uVar11 = uVar11 + 1) {
        pAVar8 = Abc_NtkObj(p->pNtk,pCut->pLeaves[uVar11]);
        piVar1 = &(pAVar8->vFanouts).nSize;
        *piVar1 = *piVar1 + -1;
      }
      if (iVar3 == (uVar4 >> 6 & 0x3f) - (uVar4 >> 0xc & 0x3f)) {
        aVar6 = Abc_Clock();
        pTruth = Lpk_CutTruth(p,pCut,0);
        uVar4 = Extra_TruthSupportSize(pTruth,*(uint *)pCut & 0x3f);
        aVar7 = Abc_Clock();
        p->timeTruth = p->timeTruth + (aVar7 - aVar6);
        pNtk = Kit_DsdDecompose(pTruth,*(uint *)pCut & 0x3f);
        pKVar9 = Kit_DsdNtkRoot(pNtk);
        if (((uint)*pKVar9 & 0xfc000000) != 0x40000000) {
          iVar5 = Kit_DsdNonDsdSizeMax(pNtk);
          iVar3 = p->pPars->nLutSize;
          if ((iVar5 <= iVar3) ||
             ((int)uVar4 <=
              (int)((iVar3 + -1) *
                   ((~*(uint *)pCut >> 0xc | 0xffffffc0) + (*(uint *)pCut >> 6 & 0x3f))))) {
            if (p->pPars->fVeryVerbose != 0) {
              uVar2 = *(uint *)pCut;
              printf("  C%02d: L= %2d/%2d  V= %2d/%d  N= %d  W= %4.2f  ",(double)pCut->Weight,
                     uVar10 & 0xffffffff,(ulong)(uVar2 & 0x3f),(ulong)uVar4,
                     (ulong)(uVar2 >> 6 & 0x3f),(ulong)(uVar2 >> 0xc & 0x3f),uVar2 >> 0x12 & 0x3f);
              Kit_DsdPrint(_stdout,pNtk);
              Kit_DsdPrintFromTruth(pTruth,*(uint *)pCut & 0x3f);
            }
            aVar6 = Abc_Clock();
            iVar3 = Lpk_ExploreCut(p,pCut,pNtk);
            aVar7 = Abc_Clock();
            p->timeEval = p->timeEval + (aVar7 - aVar6);
            Kit_DsdNtkFree(pNtk);
            if (iVar3 == 0) goto LAB_003e50cc;
            break;
          }
        }
        Kit_DsdNtkFree(pNtk);
      }
LAB_003e50cc:
      uVar10 = uVar10 + 1;
      iVar3 = p->nEvals;
    }
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

int Lpk_ResynthesizeNode( Lpk_Man_t * p )
{
//    static int Count = 0;
    Kit_DsdNtk_t * pDsdNtk;
    Lpk_Cut_t * pCut;
    unsigned * pTruth;
    int i, k, nSuppSize, nCutNodes, RetValue;
    abctime clk;

    // compute the cuts
clk = Abc_Clock();
    if ( !Lpk_NodeCuts( p ) )
    {
p->timeCuts += Abc_Clock() - clk;
        return 0;
    }
p->timeCuts += Abc_Clock() - clk;

//return 0;

    if ( p->pPars->fVeryVerbose )
    printf( "Node %5d : Mffc size = %5d. Cuts = %5d.\n", p->pObj->Id, p->nMffc, p->nEvals );
    // try the good cuts
    p->nCutsTotal  += p->nCuts;
    p->nCutsUseful += p->nEvals;
    for ( i = 0; i < p->nEvals; i++ )
    {
        // get the cut
        pCut = p->pCuts + p->pEvals[i];
        if ( p->pPars->fFirst && i == 1 )
            break;

        // skip bad cuts        
//        printf( "Mffc size = %d.  ", Abc_NodeMffcLabel(p->pObj) );
        for ( k = 0; k < (int)pCut->nLeaves; k++ )
            Abc_NtkObj(p->pNtk, pCut->pLeaves[k])->vFanouts.nSize++;
        nCutNodes = Abc_NodeMffcLabel(p->pObj);
//        printf( "Mffc with cut = %d.  ", nCutNodes );
        for ( k = 0; k < (int)pCut->nLeaves; k++ )
            Abc_NtkObj(p->pNtk, pCut->pLeaves[k])->vFanouts.nSize--;
//        printf( "Mffc cut = %d.  ", (int)pCut->nNodes - (int)pCut->nNodesDup );
//        printf( "\n" );
        if ( nCutNodes != (int)pCut->nNodes - (int)pCut->nNodesDup )
            continue;

        // compute the truth table
clk = Abc_Clock();
        pTruth = Lpk_CutTruth( p, pCut, 0 );
        nSuppSize = Extra_TruthSupportSize(pTruth, pCut->nLeaves);
p->timeTruth += Abc_Clock() - clk;

        pDsdNtk = Kit_DsdDecompose( pTruth, pCut->nLeaves ); 
//        Kit_DsdVerify( pDsdNtk, pTruth, pCut->nLeaves ); 
        // skip 16-input non-DSD because ISOP will not work
        if ( Kit_DsdNtkRoot(pDsdNtk)->nFans == 16 ) 
        {
            Kit_DsdNtkFree( pDsdNtk );
            continue;
        }

        // if DSD has nodes that require splitting to fit them into LUTs
        // we can skip those cuts that cannot lead to improvement
        // (a full DSD network requires  V = Nmin * (K-1) + 1 for improvement)
        if ( Kit_DsdNonDsdSizeMax(pDsdNtk) > p->pPars->nLutSize && 
             nSuppSize >= ((int)pCut->nNodes - (int)pCut->nNodesDup - 1) * (p->pPars->nLutSize - 1) + 1 )
        {
            Kit_DsdNtkFree( pDsdNtk );
            continue;
        }

        if ( p->pPars->fVeryVerbose )
        {
//            char * pFileName;
            printf( "  C%02d: L= %2d/%2d  V= %2d/%d  N= %d  W= %4.2f  ", 
                i, pCut->nLeaves, nSuppSize, pCut->nNodes, pCut->nNodesDup, pCut->nLuts, pCut->Weight );
            Kit_DsdPrint( stdout, pDsdNtk );
            Kit_DsdPrintFromTruth( pTruth, pCut->nLeaves );
//            pFileName = Kit_TruthDumpToFile( pTruth, pCut->nLeaves, Count++ );
//            printf( "Saved truth table in file \"%s\".\n", pFileName );
        }

        // update the network
clk = Abc_Clock();
        RetValue = Lpk_ExploreCut( p, pCut, pDsdNtk );
p->timeEval += Abc_Clock() - clk;
        Kit_DsdNtkFree( pDsdNtk );
        if ( RetValue )
            break;
    }
    return 1;
}